

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkToBarBufs(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  Abc_Ntk_t *pNtkNew;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pObj;
  Abc_Des_t *pAVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Abc_Ntk_t *pAVar14;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  char Buffer [1000];
  Vec_Ptr_t *local_448;
  Vec_Ptr_t *local_440;
  Vec_Ptr_t *local_438;
  Abc_Obj_t *local_430;
  long *local_428;
  Vec_Ptr_t *local_420;
  char local_418 [1000];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0xbc,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkCheckSingleInstance(pNtk);
  if (iVar4 == 0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->pDesign == (Abc_Des_t *)0x0) {
      __assert_fail("pNtk->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                    ,0xbf,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
    }
    pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
    pcVar6 = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pName = pcVar6;
    pcVar6 = Extra_UtilStrsav(pNtk->pSpec);
    pNtkNew->pSpec = pcVar6;
    Abc_NtkCleanCopy_rec(pNtk);
    pVVar8 = pNtk->vPis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pAVar9 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        pAVar7 = Abc_NtkDupObj(pNtkNew,pAVar9,1);
        *(Abc_Obj_t **)((long)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray] + 0x40) =
             pAVar7;
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk->vPis;
      } while (lVar12 < pVVar8->nSize);
    }
    pVVar8 = pNtk->vPos;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar8->pArray[lVar12],1);
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk->vPos;
      } while (lVar12 < pVVar8->nSize);
    }
    uVar5 = Abc_NtkCollectPiPos(pNtk,&local_420,&local_448);
    pVVar8 = local_420;
    if (0 < local_420->nSize) {
      lVar12 = 0;
      local_438 = local_420;
      local_440 = local_448;
      do {
        if (local_440->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_428 = (long *)local_438->pArray[lVar12];
        plVar1 = (long *)local_440->pArray[lVar12];
        pAVar9 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_BI);
        pAVar7 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_LATCH);
        pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_BO);
        Abc_ObjAddFanin(pAVar7,pAVar9);
        plVar3 = local_428;
        local_430 = pObj;
        Abc_ObjAddFanin(pObj,pAVar7);
        pAVar7->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
        pAVar14 = (Abc_Ntk_t *)
                  **(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
        if (pAVar14 == pNtk) {
          pAVar14 = (Abc_Ntk_t *)
                    **(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
          if (pAVar14 == pNtk) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                          ,0xd9,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
          }
        }
        sprintf(local_418,"_%s_in",pAVar14->pName);
        pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8));
        Abc_ObjAssignName(pAVar9,pcVar6,local_418);
        sprintf(local_418,"_%s_out",pAVar14->pName);
        pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[6] * 8));
        pAVar7 = local_430;
        Abc_ObjAssignName(local_430,pcVar6,local_418);
        plVar3[8] = (long)pAVar9;
        *(Abc_Obj_t **)
         (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8) + 0x40)
             = pAVar7;
        if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[6] * 8) + 0x14) & 0xf) != 6) {
          __assert_fail("Abc_ObjIsNet(Abc_ObjFanout0(pLoMap))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                        ,0xe0,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
        }
        lVar12 = lVar12 + 1;
        pVVar8 = local_438;
      } while (lVar12 < local_438->nSize);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    if (local_448->pArray != (void **)0x0) {
      free(local_448->pArray);
    }
    free(local_448);
    pAVar10 = pNtk->pDesign;
    pVVar8 = pAVar10->vModules;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar12];
        lVar11 = *(long *)((long)pvVar2 + 0x40);
        if (0 < *(int *)(lVar11 + 4)) {
          lVar13 = 0;
          do {
            plVar1 = *(long **)(*(long *)(lVar11 + 8) + lVar13 * 8);
            pAVar9 = (Abc_Obj_t *)plVar1[8];
            pAVar7 = Abc_NtkToBarBufs_rec
                               (pNtkNew,*(Abc_Obj_t **)
                                         (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                         (long)*(int *)plVar1[4] * 8));
            Abc_ObjAddFanin(pAVar9,pAVar7);
            lVar13 = lVar13 + 1;
            lVar11 = *(long *)((long)pvVar2 + 0x40);
          } while (lVar13 < *(int *)(lVar11 + 4));
          pAVar10 = pNtk->pDesign;
        }
        lVar12 = lVar12 + 1;
        pVVar8 = pAVar10->vModules;
      } while (lVar12 < pVVar8->nSize);
    }
    pNtkNew->nBarBufs = pNtkNew->nObjCounts[8];
    printf("Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n",
           (ulong)uVar5);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkToBarBufs( Abc_Ntk_t * pNtk )
{
    char Buffer[1000];
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Ntk_t * pNtkNew, * pTemp;
    Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k, nBoxes;
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkCheckSingleInstance(pNtk) )
        return NULL;
    assert( pNtk->pDesign != NULL );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkCleanCopy_rec( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create latches and transfer copy labels
    nBoxes = Abc_NtkCollectPiPos( pNtk, &vLiMaps, &vLoMaps );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObjLi = Abc_NtkCreateBi(pNtkNew);
        pLatch = Abc_NtkCreateLatch(pNtkNew);
        pObjLo = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pLatch, pObjLi );
        Abc_ObjAddFanin( pObjLo, pLatch );
        pLatch->pData = (void *)ABC_INIT_ZERO;
        pTemp = NULL;
        if ( Abc_ObjFanin0(pLiMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanin0(pLiMap)->pNtk;
        else if ( Abc_ObjFanout0(pLoMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanout0(pLoMap)->pNtk;
        else assert( 0 );
        sprintf( Buffer, "_%s_in", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLi, Abc_ObjName(Abc_ObjFanin0(pLiMap)), Buffer );
        sprintf( Buffer, "_%s_out", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLo, Abc_ObjName(Abc_ObjFanout0(pLoMap)), Buffer );
        pLiMap->pCopy = pObjLi;
        Abc_ObjFanout0(pLoMap)->pCopy = pObjLo;
        assert( Abc_ObjIsNet(Abc_ObjFanout0(pLoMap)) );
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // rebuild networks
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachCo( pTemp, pObj, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkToBarBufs_rec(pNtkNew, Abc_ObjFanin0(pObj)) );
    pNtkNew->nBarBufs = Abc_NtkLatchNum(pNtkNew);
    printf( "Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n", nBoxes, pNtkNew->nBarBufs );
    return pNtkNew;
}